

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O0

char * FindLatestNMEASentence(char *sentencebegin,char *str)

{
  size_t sVar1;
  char *local_28;
  char *foundstr;
  char *ptr;
  char *str_local;
  char *sentencebegin_local;
  
  local_28 = (char *)0x0;
  for (foundstr = FindNMEASentence(sentencebegin,str); foundstr != (char *)0x0;
      foundstr = FindNMEASentence(sentencebegin,foundstr + sVar1)) {
    local_28 = foundstr;
    sVar1 = strlen(sentencebegin);
  }
  return local_28;
}

Assistant:

inline char* FindLatestNMEASentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = FindNMEASentence(sentencebegin, str);
	while (ptr) 
	{
		// Save the position of the beginning of the sentence.
		foundstr = ptr;

		// Search just after the beginning of the sentence.
		ptr = FindNMEASentence(sentencebegin, foundstr+strlen(sentencebegin));
	}

	return foundstr;
}